

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<pstore::serialize::archive::void_type> *
testing::internal::ActionResultHolder<pstore::serialize::archive::void_type>::
PerformAction<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>
          (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *action,
          ArgumentTuple *args)

{
  ActionResultHolder<pstore::serialize::archive::void_type> *pAVar1;
  ArgumentTuple local_28;
  
  pAVar1 = (ActionResultHolder<pstore::serialize::archive::void_type> *)operator_new(0x10);
  local_28.super__Tuple_impl<0UL,_pstore::gsl::span<int,__1L>_>.
  super__Head_base<0UL,_pstore::gsl::span<int,__1L>,_false>._M_head_impl.storage_.
  super_extent_type<_1L>.size_ =
       (args->super__Tuple_impl<0UL,_pstore::gsl::span<int,__1L>_>).
       super__Head_base<0UL,_pstore::gsl::span<int,__1L>,_false>._M_head_impl.storage_.
       super_extent_type<_1L>.size_;
  local_28.super__Tuple_impl<0UL,_pstore::gsl::span<int,__1L>_>.
  super__Head_base<0UL,_pstore::gsl::span<int,__1L>,_false>._M_head_impl.storage_.data_ =
       (args->super__Tuple_impl<0UL,_pstore::gsl::span<int,__1L>_>).
       super__Head_base<0UL,_pstore::gsl::span<int,__1L>,_false>._M_head_impl.storage_.data_;
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Perform
            (action,&local_28);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001878f0;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }